

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

int is(atom a,atom b)

{
  int iVar1;
  anon_union_8_9_1d3277aa_for_value aVar2;
  anon_union_8_9_1d3277aa_for_value aVar3;
  bool bVar4;
  
  aVar2 = b.value;
  aVar3 = a.value;
  if (a.type == b.type) {
    switch(a._0_8_ & 0xffffffff) {
    case 0:
      bVar4 = true;
      break;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xd:
      bVar4 = aVar3.pair == aVar2.pair;
      break;
    case 3:
      bVar4 = (bool)(-(aVar2.number == aVar3.number) & 1);
      break;
    case 7:
      iVar1 = strcmp((aVar3.str)->value,*(char **)&(aVar2.str)->value);
      bVar4 = iVar1 == 0;
      break;
    case 0xc:
      bVar4 = a.value._0_1_ == b.value._0_1_;
      break;
    default:
      goto switchD_0010508e_default;
    }
  }
  else {
switchD_0010508e_default:
    bVar4 = false;
  }
  return (int)bVar4;
}

Assistant:

int is(atom a, atom b) {
	if (a.type == b.type) {
		switch (a.type) {
		case T_NIL:
			return 1;
		case T_CONS:
		case T_CLOSURE:
		case T_MACRO:
			return (a.value.pair == b.value.pair);
		case T_SYM:
			return (a.value.symbol == b.value.symbol);
		case T_NUM:
			return (a.value.number == b.value.number);
		case T_BUILTIN:
			return (a.value.builtin == b.value.builtin);
		case T_STRING:
			return strcmp(a.value.str->value, b.value.str->value) == 0;
		case T_CHAR:
			return (a.value.ch == b.value.ch);
		case T_TABLE:
			return a.value.table == b.value.table;
		case T_INPUT:
		case T_INPUT_PIPE:
		case T_OUTPUT:
			return a.value.fp == b.value.fp;
		case T_CONTINUATION:
			return a.value.jb == b.value.jb;
		}
	}
	return 0;
}